

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::
emplace_back<slang::ast::PortSymbol::NetTypeRange>
          (SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *this,NetTypeRange *args)

{
  iterator pNVar1;
  undefined8 *in_RSI;
  SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *in_RDI;
  NetTypeRange *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<slang::ast::PortSymbol::NetTypeRange>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    pNVar1 = end(in_RDI);
    pNVar1->netType = (NetType *)*in_RSI;
    *(undefined8 *)&pNVar1->width = in_RSI[1];
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }